

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack19_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x80000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 0xd;
  *puVar1 = (in[2] - base) * 0x40 | *puVar1;
  *puVar1 = (in[3] - base) * 0x2000000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] - base >> 7;
  *puVar1 = (in[4] - base) * 0x1000 | *puVar1;
  *puVar1 = (in[5] - base) * -0x80000000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[5] - base >> 1;
  *puVar1 = (in[6] - base) * 0x40000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[6] - base >> 0xe;
  *puVar1 = (in[7] - base) * 0x20 | *puVar1;
  return out + 5;
}

Assistant:

uint32_t * pack19_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;

    return out + 1;
}